

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O0

Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
mprpc::MpRpcClient::asnyc_call_abi_cxx11_
          (MpRpcClient *this,char *method,char *params,size_t params_size,int timeout_ms)

{
  MessageLoop *this_00;
  undefined4 in_register_00000084;
  int in_R9D;
  anon_class_48_5_1470e6a5 local_e8;
  Closure local_b8;
  char *local_98;
  undefined1 local_90 [8];
  shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  prom;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> msg;
  undefined1 local_60 [8];
  MsgPackPacker pk;
  int callid;
  int timeout_ms_local;
  size_t params_size_local;
  char *params_local;
  char *method_local;
  MpRpcClient *this_local;
  
  pk.pk.callback._4_4_ = in_R9D;
  pk.pk.callback._0_4_ = std::__atomic_base<int>::operator++((__atomic_base<int> *)(method + 0x548))
  ;
  MsgPackPacker::MsgPackPacker((MsgPackPacker *)local_60);
  MsgPackPacker::pack_map((MsgPackPacker *)local_60,3);
  MsgPackPacker::pack_map_item((MsgPackPacker *)local_60,"id",(__int_type)pk.pk.callback);
  MsgPackPacker::pack_map_item((MsgPackPacker *)local_60,"method",params);
  MsgPackPacker::pack_map_item_obj
            ((MsgPackPacker *)local_60,"params",(char *)params_size,
             CONCAT44(in_register_00000084,timeout_ms));
  std::make_shared<std::__cxx11::string,char*&,unsigned_long&>
            ((char **)&prom.
                       super___shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,(unsigned_long *)&pk);
  local_98 = method + 0x10;
  std::
  make_shared<loop::Promise<mprpc::MpRpcMessage,std::pair<int,std::__cxx11::string>>,loop::MessageLoop*>
            ((MessageLoop **)local_90);
  this_00 = loop::MsgLoopRun::msg_loop((MsgLoopRun *)(method + 8));
  local_e8.this = (MpRpcClient *)method;
  std::
  shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::shared_ptr(&local_e8.prom,
               (shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_90);
  local_e8.callid = (__int_type)pk.pk.callback;
  local_e8.timeout_ms = pk.pk.callback._4_4_;
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr(&local_e8.msg,
               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&prom.
                   super___shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
  std::function<void()>::
  function<mprpc::MpRpcClient::asnyc_call[abi:cxx11](char_const*,char_const*,unsigned_long,int)::__0,void>
            ((function<void()> *)&local_b8,&local_e8);
  loop::MessageLoop::post_task(this_00,&local_b8);
  std::function<void_()>::~function(&local_b8);
  asnyc_call[abi:cxx11](char_const*,char_const*,unsigned_long,int)::$_0::~__0((__0 *)&local_e8);
  std::
  __shared_ptr_access<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_90);
  loop::
  Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get_future((Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
  std::
  shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_90);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&prom.
                    super___shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  MsgPackPacker::~MsgPackPacker((MsgPackPacker *)local_60);
  return (Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this;
}

Assistant:

Future<MpRpcMessage, pair<int, string>> MpRpcClient::asnyc_call(const char* method, const char* params, size_t params_size, int timeout_ms)
    {
        int callid = ++m_cur_callid;
        MsgPackPacker pk;
        pk.pack_map(3);
        pk.pack_map_item("id", callid);
        pk.pack_map_item("method", method);
        pk.pack_map_item_obj("params", params, params_size);

        auto msg = make_shared<string>(pk.sb.data, pk.sb.size);
        auto prom = make_shared<AsyncCallPromise>(&this->m_msg_loop);

        this->msg_loop().post_task([this, prom, callid, timeout_ms, msg]() {
            m_conn->send(msg->data(), msg->size());
            m_on_rsp_map[callid] = OnRspHandler(prom, system_clock::now() + milliseconds(timeout_ms));
        });
        return prom->get_future();
    }